

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetAccessors
               (RecyclableObject *instance,PropertyId propertyId,ScriptContext *requestContext,
               Var *getter,Var *setter)

{
  BOOL BVar1;
  int iVar2;
  Var pvVar3;
  RecyclableObject *local_40;
  RecyclableObject *object;
  Var *setter_local;
  Var *getter_local;
  ScriptContext *requestContext_local;
  PropertyId propertyId_local;
  RecyclableObject *instance_local;
  
  local_40 = instance;
  while( true ) {
    BVar1 = IsNull(local_40);
    if (BVar1 != 0) {
      return 0;
    }
    iVar2 = (*(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x15])
                      (local_40,(ulong)(uint)propertyId,getter,setter,requestContext);
    if (iVar2 != 0) break;
    BVar1 = RecyclableObject::SkipsPrototype(local_40);
    if (BVar1 != 0) {
      return 0;
    }
    local_40 = GetPrototype(local_40);
  }
  pvVar3 = CanonicalizeAccessor(*getter,requestContext);
  *getter = pvVar3;
  pvVar3 = CanonicalizeAccessor(*setter,requestContext);
  *setter = pvVar3;
  return 1;
}

Assistant:

JavascriptOperators::GetAccessors(RecyclableObject* instance, PropertyId propertyId, ScriptContext* requestContext, _Out_ Var* getter, _Out_ Var* setter)
    {
        RecyclableObject* object = instance;
        while (!JavascriptOperators::IsNull(object))
        {
            if (object->GetAccessors(propertyId, getter, setter, requestContext))
            {
                *getter = JavascriptOperators::CanonicalizeAccessor(*getter, requestContext);
                *setter = JavascriptOperators::CanonicalizeAccessor(*setter, requestContext);
                return TRUE;
            }

            if (object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototype(object);
        }
        return FALSE;
    }